

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::LogMessage::SendToSink(LogMessage *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  LogMessage *this_local;
  
  if ((this->data_->field_6).sink_ != (LogSink *)0x0) {
    if ((this->data_->num_chars_to_log_ == 0) ||
       (this->data_->message_text_[this->data_->num_chars_to_log_ - 1] != '\n')) {
      RawLog__(3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,0x624,"Check %s failed: %s",
               "data_->num_chars_to_log_ > 0 && data_->message_text_[data_->num_chars_to_log_-1] == \'\\n\'"
               ,"");
    }
    pvVar1 = (this->data_->field_6).outvec_;
    (*(code *)(((pvVar1->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->field_2)._M_allocated_capacity)
              (pvVar1,(int)this->data_->severity_,this->data_->fullname_,this->data_->basename_,
               this->data_->line_,&this->data_->tm_time_,
               this->data_->message_text_ + this->data_->num_prefix_chars_,
               (this->data_->num_chars_to_log_ - this->data_->num_prefix_chars_) + -1);
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  if (data_->sink_ != NULL) {
    RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
               data_->message_text_[data_->num_chars_to_log_-1] == '\n', "");
    data_->sink_->send(data_->severity_, data_->fullname_, data_->basename_,
                       data_->line_, &data_->tm_time_,
                       data_->message_text_ + data_->num_prefix_chars_,
                       (data_->num_chars_to_log_ -
                        data_->num_prefix_chars_ - 1));
  }
}